

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O0

bool __thiscall
ON_SubDMeshFragment::ReserveManagedVertexCapacity(ON_SubDMeshFragment *this,size_t vertex_capacity)

{
  ushort uVar1;
  bool bVar2;
  uint uVar3;
  size_t current_capacity;
  size_t vertex_capacity_local;
  ON_SubDMeshFragment *this_local;
  
  if (vertex_capacity < 0x1001) {
    if (vertex_capacity < 0x2000) {
      bVar2 = UnmanagedArrays(this);
      if (bVar2) {
        ON_SubDIncrementErrorCount();
        this_local._7_1_ = false;
      }
      else {
        uVar1 = this->m_vertex_capacity_etc;
        bVar2 = ManagedArrays(this);
        if (bVar2) {
          if (vertex_capacity <= (ulong)(long)(int)(uVar1 & 0x1fff)) {
            return true;
          }
          DeleteManagedArrays(this);
        }
        Internal_LayoutArrays(this,vertex_capacity,(double *)0x0);
        uVar3 = VertexCapacity(this);
        this_local._7_1_ = vertex_capacity <= uVar3;
      }
    }
    else {
      ON_SubDIncrementErrorCount();
      this_local._7_1_ = false;
    }
  }
  else {
    ON_SubDIncrementErrorCount();
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_SubDMeshFragment::ReserveManagedVertexCapacity(size_t vertex_capacity)
{
  if (vertex_capacity < 0 || vertex_capacity >(size_t)ON_SubDMeshFragment::MaximumVertexCount)
    return ON_SUBD_RETURN_ERROR(false);
  if (vertex_capacity > (size_t)(ON_SubDMeshFragment::ValueMask))
    return ON_SUBD_RETURN_ERROR(false); // too big
  if (UnmanagedArrays())
  {
    // attempting to convert externally managed memory to internally managed memory.
    return ON_SUBD_RETURN_ERROR(false);
  }
  const size_t current_capacity = (size_t)(ON_SubDMeshFragment::ValueMask & m_vertex_capacity_etc);
  if (ManagedArrays())
  {
    if (current_capacity >= vertex_capacity)
      return true;
    DeleteManagedArrays();
  }

  Internal_LayoutArrays( vertex_capacity, nullptr );
  return (this->VertexCapacity() >= vertex_capacity);
}